

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

wchar_t calc_unlocking_chance(player *p,wchar_t lock_power,_Bool lock_unseen)

{
  int16_t *piVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  undefined7 in_register_00000011;
  
  wVar3 = (p->state).skills[0];
  piVar1 = p->timed;
  if (((int)CONCAT71(in_register_00000011,lock_unseen) != 0) || (piVar1[2] != 0)) {
    wVar3 = wVar3 / 10;
  }
  if ((piVar1[4] != 0) || (piVar1[6] != 0)) {
    wVar3 = wVar3 / 10;
  }
  wVar3 = wVar3 + lock_power * -4;
  wVar2 = L'\x02';
  if (L'\x02' < wVar3) {
    wVar2 = wVar3;
  }
  return wVar2;
}

Assistant:

int calc_unlocking_chance(const struct player *p, int lock_power,
		bool lock_unseen)
{
	int skill = p->state.skills[SKILL_DISARM_PHYS];

	if (lock_unseen || p->timed[TMD_BLIND]) {
		skill /= 10;
	}
	if (p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Always allow some chance of unlocking. */
	return MAX(2, skill - 4 * lock_power);
}